

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

void ncnn::requantize(int *intptr,char *ptr,float scale_in,float bias,float scale_out,
                     int activation_type,Mat *activation_params,int size)

{
  char cVar1;
  float *pfVar2;
  long *in_RCX;
  undefined4 in_EDX;
  char *in_RSI;
  int *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  float v;
  int i;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float in_stack_ffffffffffffff30;
  float local_cc;
  int local_b8;
  char *local_98;
  int *local_90;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_54 [5];
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_20;
  undefined8 local_10;
  
  local_98 = in_RSI;
  local_90 = in_RDI;
  for (local_b8 = 0; local_b8 < in_R8D; local_b8 = local_b8 + 1) {
    local_cc = (float)*local_90 * in_XMM0_Da + in_XMM1_Da;
    local_54[0] = local_cc;
    switch(in_EDX) {
    case 1:
      if (local_cc <= 0.0) {
        local_54[0] = 0.0;
      }
      break;
    case 2:
      local_10 = 0;
      local_64 = *(float *)*in_RCX;
      if (local_cc <= 0.0) {
        local_cc = local_cc * local_64;
      }
      local_54[0] = local_cc;
      break;
    case 3:
      local_20 = 0;
      local_68 = *(float *)*in_RCX;
      local_30 = 1;
      local_6c = *(float *)(*in_RCX + 4);
      if (local_cc < local_68) {
        local_54[0] = local_68;
      }
      if (local_6c < local_54[0]) {
        local_54[0] = local_6c;
      }
      break;
    case 4:
      local_70 = 88.37626;
      pfVar2 = std::min<float>(local_54,&local_70);
      local_54[0] = *pfVar2;
      local_74 = -88.37626;
      pfVar2 = std::max<float>(local_54,&local_74);
      local_54[0] = *pfVar2;
      fVar3 = expf(-local_54[0]);
      local_54[0] = 1.0 / (fVar3 + 1.0);
      break;
    case 5:
      fVar3 = expf(local_cc);
      fVar3 = logf(fVar3 + 1.0);
      local_54[0] = tanhf(fVar3);
      local_54[0] = local_cc * local_54[0];
      in_stack_ffffffffffffff30 = local_cc;
      break;
    case 6:
      local_40 = 0;
      fVar3 = *(float *)*in_RCX;
      local_54[1] = 1.4013e-45;
      local_54[2] = 0.0;
      fVar4 = -*(float *)(*in_RCX + 4) / fVar3;
      if (fVar4 <= local_cc) {
        if (local_cc <= 1.0 / fVar3 + fVar4) {
          local_54[0] = local_cc * (local_cc * fVar3 + *(float *)(*in_RCX + 4));
        }
      }
      else {
        local_54[0] = 0.0;
      }
    }
    cVar1 = float2int8(in_stack_ffffffffffffff30);
    *local_98 = cVar1;
    local_90 = local_90 + 1;
    local_98 = local_98 + 1;
  }
  return;
}

Assistant:

static void requantize(const int* intptr, signed char* ptr, float scale_in, float bias, float scale_out, int activation_type, const Mat& activation_params, int size)
{
    for (int i = 0; i < size; i++)
    {
        float v = *intptr * scale_in + bias;
        v = activation_ss(v, activation_type, activation_params);
        *ptr = float2int8(v * scale_out);
        intptr++;
        ptr++;
    }
}